

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,op) == 0x163) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
    uVar1 = data->R0;
    uVar2 = data->R1;
    pPVar6 = FunctionProxy::EnsureDeserialized(this);
    iVar5 = (*(pPVar6->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar6);
    Output::Print(L" R%d, R%d = %s(), env:R%d",(ulong)uVar1,(ulong)uVar2,
                  CONCAT44(extraout_var,iVar5),(ulong)data->R2);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x53a,"(false)","Unknown Reg3U opcode");
  if (bVar4) {
    *puVar7 = 0;
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
    ByteCodeDumper::DumpReg3U(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitInnerBaseClass:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d, R%d = %s(), env:R%d"), data->R0, data->R1, pfuncActual->EnsureDeserialized()->GetDisplayName(), data->R2);
                break;
            }

            default:
                AssertMsg(false, "Unknown Reg3U opcode");
                break;
        }
    }